

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_path_or_unary_expression(xpath_parser *this)

{
  lexeme_t lVar1;
  nodetest_t nVar2;
  xpath_value_type xVar3;
  xpath_ast_node *pxVar4;
  xpath_lexer_string *name;
  xpath_ast_node *n_1;
  xpath_parser *pxStack_28;
  lexeme_t l;
  xpath_ast_node *n;
  char_t *state;
  xpath_parser *this_local;
  
  lVar1 = xpath_lexer::current(&this->_lexer);
  if ((((lVar1 != lex_var_ref) &&
       (lVar1 = xpath_lexer::current(&this->_lexer), lVar1 != lex_open_brace)) &&
      (lVar1 = xpath_lexer::current(&this->_lexer), lVar1 != lex_quoted_string)) &&
     ((lVar1 = xpath_lexer::current(&this->_lexer), lVar1 != lex_number &&
      (lVar1 = xpath_lexer::current(&this->_lexer), lVar1 != lex_string)))) {
    lVar1 = xpath_lexer::current(&this->_lexer);
    if (lVar1 != lex_minus) {
      pxVar4 = parse_location_path(this);
      return pxVar4;
    }
    xpath_lexer::next(&this->_lexer);
    pxVar4 = parse_expression(this,7);
    if (pxVar4 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar4 = alloc_node(this,ast_op_negate,xpath_type_number,pxVar4,(xpath_ast_node *)0x0);
    return pxVar4;
  }
  lVar1 = xpath_lexer::current(&this->_lexer);
  if (lVar1 == lex_string) {
    n = (xpath_ast_node *)xpath_lexer::state(&this->_lexer);
    while (((anonymous_namespace)::chartype_table[(byte)n->_type] & 8) != 0) {
      n = (xpath_ast_node *)&n->_rettype;
    }
    if (n->_type != '(') {
      pxVar4 = parse_location_path(this);
      return pxVar4;
    }
    name = xpath_lexer::contents(&this->_lexer);
    nVar2 = parse_node_test_type(this,name);
    if (nVar2 != nodetest_none) {
      pxVar4 = parse_location_path(this);
      return pxVar4;
    }
  }
  pxStack_28 = (xpath_parser *)parse_filter_expression(this);
  if (pxStack_28 == (xpath_parser *)0x0) {
    this_local = (xpath_parser *)0x0;
  }
  else {
    lVar1 = xpath_lexer::current(&this->_lexer);
    if ((lVar1 == lex_slash) ||
       (lVar1 = xpath_lexer::current(&this->_lexer), this_local = pxStack_28,
       lVar1 == lex_double_slash)) {
      lVar1 = xpath_lexer::current(&this->_lexer);
      xpath_lexer::next(&this->_lexer);
      if (lVar1 == lex_double_slash) {
        xVar3 = xpath_ast_node::rettype((xpath_ast_node *)pxStack_28);
        if (xVar3 != xpath_type_node_set) {
          pxVar4 = error(this,"Step has to be applied to node set");
          return pxVar4;
        }
        pxStack_28 = (xpath_parser *)
                     alloc_node(this,ast_step,(xpath_ast_node *)pxStack_28,axis_descendant_or_self,
                                nodetest_type_node,(char_t *)0x0);
        if (pxStack_28 == (xpath_parser *)0x0) {
          return (xpath_ast_node *)0x0;
        }
      }
      this_local = (xpath_parser *)parse_relative_location_path(this,(xpath_ast_node *)pxStack_28);
    }
  }
  return (xpath_ast_node *)this_local;
}

Assistant:

xpath_ast_node* parse_path_or_unary_expression()
		{
			// Clarification.
			// PathExpr begins with either LocationPath or FilterExpr.
			// FilterExpr begins with PrimaryExpr
			// PrimaryExpr begins with '$' in case of it being a variable reference,
			// '(' in case of it being an expression, string literal, number constant or
			// function call.
			if (_lexer.current() == lex_var_ref || _lexer.current() == lex_open_brace ||
				_lexer.current() == lex_quoted_string || _lexer.current() == lex_number ||
				_lexer.current() == lex_string)
			{
				if (_lexer.current() == lex_string)
				{
					// This is either a function call, or not - if not, we shall proceed with location path
					const char_t* state = _lexer.state();

					while (PUGI__IS_CHARTYPE(*state, ct_space)) ++state;

					if (*state != '(')
						return parse_location_path();

					// This looks like a function call; however this still can be a node-test. Check it.
					if (parse_node_test_type(_lexer.contents()) != nodetest_none)
						return parse_location_path();
				}

				xpath_ast_node* n = parse_filter_expression();
				if (!n) return 0;

				if (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
				{
					lexeme_t l = _lexer.current();
					_lexer.next();

					if (l == lex_double_slash)
					{
						if (n->rettype() != xpath_type_node_set)
							return error("Step has to be applied to node set");

						n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, 0);
						if (!n) return 0;
					}

					// select from location path
					return parse_relative_location_path(n);
				}

				return n;
			}
			else if (_lexer.current() == lex_minus)
			{
				_lexer.next();

				// precedence 7+ - only parses union expressions
				xpath_ast_node* n = parse_expression(7);
				if (!n) return 0;

				return alloc_node(ast_op_negate, xpath_type_number, n);
			}
			else
			{
				return parse_location_path();
			}
		}